

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reorg.cpp
# Opt level: O1

int __thiscall ncnn::Reorg::forward(Reorg *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  void *pvVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  undefined4 *puVar12;
  undefined4 *puVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  undefined4 *puVar18;
  ulong uVar19;
  undefined4 *puVar20;
  int _w;
  ulong uVar21;
  int _h;
  ulong local_98;
  ulong local_88;
  undefined4 *local_80;
  undefined4 *local_68;
  
  uVar1 = bottom_blob->c;
  iVar11 = this->stride;
  uVar9 = (long)bottom_blob->w / (long)iVar11;
  uVar10 = (long)bottom_blob->h / (long)iVar11;
  _w = (int)uVar9;
  _h = (int)uVar10;
  Mat::create(top_blob,_w,_h,uVar1 * iVar11 * iVar11,bottom_blob->elemsize,opt->blob_allocator);
  iVar11 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    if (0 < (int)uVar1) {
      local_68 = (undefined4 *)bottom_blob->data;
      sVar4 = bottom_blob->elemsize;
      uVar2 = this->stride;
      sVar5 = bottom_blob->cstep;
      lVar16 = (long)bottom_blob->w * sVar4;
      local_98 = 0;
      do {
        if (0 < (int)uVar2) {
          iVar11 = this->mode;
          pvVar6 = top_blob->data;
          sVar7 = top_blob->cstep;
          sVar8 = top_blob->elemsize;
          local_80 = local_68;
          local_88 = 0;
          do {
            if (0 < (int)uVar2) {
              iVar3 = this->stride;
              uVar21 = 0;
              puVar20 = local_80;
              do {
                if (0 < _h) {
                  iVar17 = ((int)local_98 * uVar2 + (int)local_88) * uVar2 + (int)uVar21;
                  if (iVar11 != 0) {
                    iVar17 = (uVar2 * (int)local_88 + (int)uVar21) * uVar1 + (int)local_98;
                  }
                  puVar13 = (undefined4 *)((long)iVar17 * sVar7 * sVar8 + (long)pvVar6);
                  uVar19 = 0;
                  puVar18 = puVar20;
                  do {
                    uVar15 = uVar9 & 0xffffffff;
                    puVar12 = puVar18;
                    if (0 < _w) {
                      do {
                        *puVar13 = *puVar12;
                        puVar13 = puVar13 + 1;
                        puVar12 = puVar12 + iVar3;
                        uVar14 = (int)uVar15 - 1;
                        uVar15 = (ulong)uVar14;
                      } while (uVar14 != 0);
                    }
                    uVar19 = uVar19 + 1;
                    puVar18 = (undefined4 *)((long)puVar18 + lVar16 * iVar3);
                  } while (uVar19 != (uVar10 & 0xffffffff));
                }
                uVar21 = uVar21 + 1;
                puVar20 = puVar20 + 1;
              } while (uVar21 != uVar2);
            }
            local_88 = local_88 + 1;
            local_80 = (undefined4 *)((long)local_80 + lVar16);
          } while (local_88 != uVar2);
        }
        local_98 = local_98 + 1;
        local_68 = (undefined4 *)((long)local_68 + sVar5 * sVar4);
      } while (local_98 != uVar1);
    }
    iVar11 = 0;
  }
  return iVar11;
}

Assistant:

int Reorg::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    int outw = w / stride;
    int outh = h / stride;
    int outc = channels * stride * stride;

    top_blob.create(outw, outh, outc, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const Mat m = bottom_blob.channel(q);

        for (int sh = 0; sh < stride; sh++)
        {
            for (int sw = 0; sw < stride; sw++)
            {
                int p;
                if (mode == 0)
                    p = q * stride * stride + sh * stride + sw;
                else // if (mode == 1)
                    p = (sh * stride + sw) * channels + q;

                float* outptr = top_blob.channel(p);

                for (int i = 0; i < outh; i++)
                {
                    const float* sptr = m.row(i * stride + sh) + sw;
                    for (int j = 0; j < outw; j++)
                    {
                        outptr[0] = sptr[0];

                        sptr += stride;
                        outptr++;
                    }
                }
            }
        }
    }

    return 0;
}